

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O1

void __thiscall
nnad::FeedForwardNN<double>::FeedForwardNN
          (FeedForwardNN<double> *this,vector<int,_std::allocator<int>_> *Arch,int *RandomSeed,
          bool *Report,function<double_(const_double_&)> *ActFun,
          function<double_(const_double_&)> *dActFun,OutputFunction *OutputFunc,
          Preprocessing *Preproc,vector<double,_std::allocator<double>_> *PreprocPars)

{
  pointer **pppdVar1;
  _Rb_tree_header *p_Var2;
  OutputFunction OVar3;
  pointer piVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined8 *puVar10;
  long *plVar11;
  ostream *poVar12;
  ulong *puVar13;
  long *plVar14;
  pointer *ppdVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [8];
  pointer pdVar20;
  uint uVar21;
  _Head_base<3UL,_int,_false> _Var22;
  long lVar23;
  _Head_base<3UL,_int,_false> _Var24;
  int *n;
  ulong uVar25;
  pointer pcVar26;
  int *piVar27;
  uint __uval;
  string name;
  string name_1;
  string __str;
  vector<int,_std::allocator<int>_> sub_seeds;
  string __str_3;
  string __str_2;
  string __str_1;
  uint local_214;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  undefined1 local_200 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f8;
  _Head_base<1UL,_int,_false> local_1e8;
  _Head_base<0UL,_bool,_false> local_1e4;
  undefined2 local_1e3;
  undefined1 local_1e1;
  uint local_1dc;
  Matrix<double> local_1d8;
  ulong local_1b8;
  undefined2 local_1ae;
  undefined1 local_1ac;
  undefined2 local_1ab;
  undefined1 local_1a9;
  vector<double,_std::allocator<double>_> local_1a8;
  undefined8 uStack_190;
  pointer *local_188;
  long local_180;
  pointer local_178;
  long lStack_170;
  long *local_168;
  undefined8 local_160;
  long local_158;
  undefined8 uStack_150;
  vector<int,_std::allocator<int>_> local_148;
  function<double_(const_double_&)> *local_130;
  function<double_(const_double_&)> *local_128;
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_120;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
  *local_118;
  _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
  *local_110;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_108;
  ulong local_100;
  pointer *local_f8;
  long local_f0;
  pointer local_e8 [2];
  pointer *local_d8;
  long local_d0;
  pointer local_c8 [2];
  function<double_(const_double_&)> *local_b8;
  function<double_(const_double_&)> *local_b0;
  _Any_data *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  *local_98;
  _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
  *local_90;
  ulong local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  bool *local_40;
  pointer local_38;
  
  local_40 = Report;
  std::vector<int,_std::allocator<int>_>::vector(&this->_Arch,Arch);
  local_b8 = &this->_ActFun;
  std::function<double_(const_double_&)>::function(local_b8,ActFun);
  local_b0 = &this->_dActFun;
  std::function<double_(const_double_&)>::function(local_b0,dActFun);
  this->_OutputFunc = *OutputFunc;
  local_a8 = (_Any_data *)&this->_Preproc;
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
              *)local_a8,Preproc);
  local_a0 = &this->_PreprocPars;
  if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
    (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(local_a0,PreprocPars);
  }
  this->_NpPrep =
       (int)((ulong)((long)(this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_130 = &this->_OutputActFun;
  local_128 = &this->_dOutputActFun;
  local_90 = (_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&this->_Links;
  p_Var2 = &(this->_Links)._M_t._M_impl.super__Rb_tree_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_OutputActFun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_OutputActFun).super__Function_base._M_functor + 8) = 0;
  (this->_OutputActFun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_OutputActFun)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_dOutputActFun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_dOutputActFun).super__Function_base._M_functor + 8) = 0;
  (this->_dOutputActFun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_dOutputActFun)._M_invoker = (_Invoker_type)0x0;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = (_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
              *)&this->_Biases;
  p_Var2 = &(this->_Biases)._M_t._M_impl.super__Rb_tree_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = (_Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
               *)&this->_IntMap;
  p_Var2 = &(this->_IntMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
               *)&this->_StrMap;
  p_Var2 = &(this->_StrMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               *)&this->_StrIntMap;
  p_Var2 = &(this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
               *)&this->_IntStrMap;
  p_Var2 = &(this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar25 = (ulong)((long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  srand(*RandomSeed);
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1b8 = uVar25;
  if (1 < (int)uVar25) {
    iVar16 = (int)uVar25 + -1;
    do {
      iVar7 = rand();
      local_210._0_4_ = iVar7;
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_148,
                   (iterator)
                   local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_210);
      }
      else {
        *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar7;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_210._0_4_ = rand();
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_148,
                   (iterator)
                   local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_210);
      }
      else {
        *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_210._0_4_;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  this->_Np = 0;
  if (1 < (int)local_1b8) {
    uVar21 = (int)local_1b8 * 2;
    iVar16 = 1;
    lVar23 = 4;
    uVar25 = 0;
    lVar17 = 4;
    do {
      if ((ulong)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar25) {
LAB_00106974:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar25);
        goto LAB_00106985;
      }
      piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      Matrix<double>::Matrix
                (&local_1d8,(int *)((long)piVar4 + lVar17),(int *)((long)piVar4 + lVar17 + -4),
                 (int *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar23 + -4));
      local_210._0_4_ = iVar16;
      local_208._M_p = (pointer)local_1d8._0_8_;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_200,&local_1d8._Matrix);
      std::
      _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
      ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
                (local_90,(pair<const_int,_nnad::Matrix<double>_> *)local_210);
      if (local_200 != (undefined1  [8])0x0) {
        operator_delete((void *)local_200,
                        CONCAT44(aStack_1f8._12_4_,aStack_1f8._8_4_) - (long)local_200);
      }
      if (local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,1);
      if ((ulong)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar25 + 1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_00106974;
      }
      Matrix<double>::Matrix
                (&local_1d8,
                 (int *)((long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar17),(int *)&local_1a8,
                 (int *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar23));
      local_208._M_p = (pointer)local_1d8._0_8_;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_200,&local_1d8._Matrix);
      std::
      _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
      ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
                (local_98,(pair<const_int,_nnad::Matrix<double>_> *)local_210);
      if (local_200 != (undefined1  [8])0x0) {
        operator_delete((void *)local_200,
                        CONCAT44(aStack_1f8._12_4_,aStack_1f8._8_4_) - (long)local_200);
      }
      if (local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar25 = uVar25 + 2;
      this->_Np = this->_Np +
                  (*(int *)((long)piVar4 + lVar17 + -4) + 1) * *(int *)((long)piVar4 + lVar17);
      iVar16 = iVar16 + 1;
      lVar17 = lVar17 + 4;
      lVar23 = lVar23 + 8;
    } while ((ulong)uVar21 - 2 != uVar25);
  }
  if (1 < (int)(uint)local_1b8) {
    pcVar26 = (pointer)0x0;
    uVar25 = (ulong)((uint)local_1b8 & 0x7fffffff);
    do {
      uVar18 = uVar25 - 1;
      local_100 = uVar25;
      if (0 < (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar25 - 1]) {
        uVar21 = (uint)uVar18;
        local_1dc = -uVar21;
        if (0 < (int)uVar21) {
          local_1dc = uVar21;
        }
        local_88 = uVar18 >> 0x1f & 1;
        local_214 = 0;
        local_1b8 = uVar18;
        do {
          uVar25 = local_88;
          uVar21 = 1;
          if (9 < local_1dc) {
            uVar8 = local_1dc;
            uVar9 = 4;
            do {
              uVar21 = uVar9;
              if (uVar8 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_001058b0;
              }
              if (uVar8 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_001058b0;
              }
              if (uVar8 < 10000) goto LAB_001058b0;
              bVar6 = 99999 < uVar8;
              uVar8 = uVar8 / 10000;
              uVar9 = uVar21 + 4;
            } while (bVar6);
            uVar21 = uVar21 + 1;
          }
LAB_001058b0:
          local_168 = &local_158;
          std::__cxx11::string::_M_construct((ulong)&local_168,(char)local_88 + (char)uVar21);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_168 + uVar25),uVar21,local_1dc);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x10a16a);
          local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar11 = puVar10 + 2;
          if ((pointer *)*puVar10 == (pointer *)plVar11) {
            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
            uStack_190 = puVar10[3];
          }
          else {
            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*puVar10;
          }
          local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puVar10[1];
          *puVar10 = plVar11;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          puVar13 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar13) {
            local_200 = (undefined1  [8])*puVar13;
            aStack_1f8._M_allocated_capacity = plVar11[3];
            local_210 = (undefined1  [8])local_200;
          }
          else {
            local_200 = (undefined1  [8])*puVar13;
            local_210 = (undefined1  [8])*plVar11;
          }
          local_208._M_p = (pointer)plVar11[1];
          *plVar11 = (long)puVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          uVar21 = 1;
          if (9 < local_214) {
            uVar8 = local_214;
            uVar9 = 4;
            do {
              uVar21 = uVar9;
              if (uVar8 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_00105a08;
              }
              if (uVar8 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_00105a08;
              }
              if (uVar8 < 10000) goto LAB_00105a08;
              bVar6 = 99999 < uVar8;
              uVar8 = uVar8 / 10000;
              uVar9 = uVar21 + 4;
            } while (bVar6);
            uVar21 = uVar21 + 1;
          }
LAB_00105a08:
          local_188 = &local_178;
          std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar21);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_188,uVar21,local_214);
          auVar19 = (undefined1  [8])(pointer)0xf;
          if (local_210 != (undefined1  [8])local_200) {
            auVar19 = local_200;
          }
          if ((ulong)auVar19 < local_208._M_p + local_180) {
            pdVar20 = (pointer)0xf;
            if (local_188 != &local_178) {
              pdVar20 = local_178;
            }
            if (pdVar20 < local_208._M_p + local_180) goto LAB_00105a8d;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_210);
          }
          else {
LAB_00105a8d:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)local_210,(ulong)local_188);
          }
          local_1d8._0_8_ =
               &local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
          pppdVar1 = (pointer **)(puVar10 + 2);
          if ((pointer **)*puVar10 == pppdVar1) {
            local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*pppdVar1;
            local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)puVar10[3];
          }
          else {
            local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*pppdVar1;
            local_1d8._0_8_ = (pointer **)*puVar10;
          }
          local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar10[1];
          *puVar10 = pppdVar1;
          puVar10[1] = 0;
          *(undefined1 *)pppdVar1 = 0;
          if (local_188 != &local_178) {
            operator_delete(local_188,(long)local_178 + 1);
          }
          if (local_210 != (undefined1  [8])local_200) {
            operator_delete((void *)local_210,(long)local_200 + 1);
          }
          if ((pointer *)
              local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          local_210 = (undefined1  [8])local_200;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_1d8._0_8_,
                     (undefined1 *)
                     ((long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_1d8._0_8_));
          _Var22._M_head_impl = (int)pcVar26;
          aStack_1f8._8_4_ = _Var22._M_head_impl;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                    (local_108,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_210);
          if (local_210 != (undefined1  [8])local_200) {
            operator_delete((void *)local_210,(long)local_200 + 1);
          }
          local_208._M_p._4_4_ = (int)local_1b8;
          local_208._M_p._0_4_ = local_214;
          local_200 = (undefined1  [8])
                      ((ulong)CONCAT52(CONCAT41(local_200._4_4_,local_1a9),local_1ab) << 8);
          local_210 = (undefined1  [8])pcVar26;
          std::
          _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
          ::_M_insert_unique<std::pair<int_const,std::tuple<bool,int,int,int>>>
                    (local_110,(pair<const_int,_std::tuple<bool,_int,_int,_int>_> *)local_210);
          local_210 = (undefined1  [8])local_200;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_1d8._0_8_,
                     (undefined1 *)
                     ((long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_1d8._0_8_));
          aStack_1f8._8_4_ = 0;
          aStack_1f8._12_4_ = local_214;
          local_1e8._M_head_impl = (int)local_1b8;
          local_1e4._M_head_impl = false;
          local_1e1 = local_1a9;
          local_1e3 = local_1ab;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>
                    (local_118,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                      *)local_210);
          if (local_210 != (undefined1  [8])local_200) {
            operator_delete((void *)local_210,(long)local_200 + 1);
          }
          local_210._0_4_ = _Var22._M_head_impl;
          local_208._M_p = local_200 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,local_1d8._0_8_,
                     (undefined1 *)
                     ((long)local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_1d8._0_8_));
          std::
          _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
          ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                    (local_120,
                     (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_210);
          if (local_208._M_p != local_200 + 8) {
            operator_delete(local_208._M_p,aStack_1f8._0_8_ + 1);
          }
          pcVar26 = (pointer)(ulong)(_Var22._M_head_impl + 1);
          if (0 < (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_100 - 2]) {
            _Var22._M_head_impl = 0;
            do {
              uVar25 = local_88;
              uVar21 = 1;
              if (9 < local_1dc) {
                uVar8 = local_1dc;
                uVar9 = 4;
                do {
                  uVar21 = uVar9;
                  if (uVar8 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_00105d4d;
                  }
                  if (uVar8 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_00105d4d;
                  }
                  if (uVar8 < 10000) goto LAB_00105d4d;
                  bVar6 = 99999 < uVar8;
                  uVar8 = uVar8 / 10000;
                  uVar9 = uVar21 + 4;
                } while (bVar6);
                uVar21 = uVar21 + 1;
              }
LAB_00105d4d:
              local_60[0] = local_50;
              local_38 = pcVar26;
              std::__cxx11::string::_M_construct((ulong)local_60,(char)local_88 + (char)uVar21);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)local_60[0] + uVar25),uVar21,local_1dc);
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_60,0,(char *)0x0,0x10a16d);
              local_80 = &local_70;
              plVar14 = plVar11 + 2;
              if ((long *)*plVar11 == plVar14) {
                local_70 = *plVar14;
                lStack_68 = plVar11[3];
              }
              else {
                local_70 = *plVar14;
                local_80 = (long *)*plVar11;
              }
              local_78 = plVar11[1];
              *plVar11 = (long)plVar14;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_80);
              local_188 = &local_178;
              ppdVar15 = (pointer *)(plVar11 + 2);
              if ((pointer *)*plVar11 == ppdVar15) {
                local_178 = *ppdVar15;
                lStack_170 = plVar11[3];
              }
              else {
                local_178 = *ppdVar15;
                local_188 = (pointer *)*plVar11;
              }
              local_180 = plVar11[1];
              *plVar11 = (long)ppdVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              uVar21 = 1;
              if (9 < local_214) {
                uVar8 = local_214;
                uVar9 = 4;
                do {
                  uVar21 = uVar9;
                  if (uVar8 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_00105ec2;
                  }
                  if (uVar8 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_00105ec2;
                  }
                  if (uVar8 < 10000) goto LAB_00105ec2;
                  bVar6 = 99999 < uVar8;
                  uVar8 = uVar8 / 10000;
                  uVar9 = uVar21 + 4;
                } while (bVar6);
                uVar21 = uVar21 + 1;
              }
LAB_00105ec2:
              local_d8 = local_c8;
              std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar21);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,uVar21,local_214);
              pdVar20 = (pointer)0xf;
              if (local_188 != &local_178) {
                pdVar20 = local_178;
              }
              if (pdVar20 < (pointer)(local_d0 + local_180)) {
                pdVar20 = (pointer)0xf;
                if (local_d8 != local_c8) {
                  pdVar20 = local_c8[0];
                }
                if (pdVar20 < (pointer)(local_d0 + local_180)) goto LAB_00105f60;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_d8,0,(char *)0x0,(ulong)local_188);
              }
              else {
LAB_00105f60:
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_d8);
              }
              local_168 = &local_158;
              plVar11 = puVar10 + 2;
              if ((long *)*puVar10 == plVar11) {
                local_158 = *plVar11;
                uStack_150 = puVar10[3];
              }
              else {
                local_158 = *plVar11;
                local_168 = (long *)*puVar10;
              }
              local_160 = puVar10[1];
              *puVar10 = plVar11;
              puVar10[1] = 0;
              *(undefined1 *)plVar11 = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_168);
              puVar13 = (ulong *)(plVar11 + 2);
              if ((ulong *)*plVar11 == puVar13) {
                local_200 = (undefined1  [8])*puVar13;
                aStack_1f8._M_allocated_capacity = plVar11[3];
                local_210 = (undefined1  [8])local_200;
              }
              else {
                local_200 = (undefined1  [8])*puVar13;
                local_210 = (undefined1  [8])*plVar11;
              }
              local_208._M_p = (pointer)plVar11[1];
              *plVar11 = (long)puVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              uVar21 = 1;
              if (9 < (uint)_Var22._M_head_impl) {
                uVar25 = (ulong)(uint)_Var22._M_head_impl;
                uVar8 = 4;
                do {
                  uVar21 = uVar8;
                  uVar9 = (uint)uVar25;
                  if (uVar9 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_0010607c;
                  }
                  if (uVar9 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_0010607c;
                  }
                  if (uVar9 < 10000) goto LAB_0010607c;
                  uVar25 = uVar25 / 10000;
                  uVar8 = uVar21 + 4;
                } while (99999 < uVar9);
                uVar21 = uVar21 + 1;
              }
LAB_0010607c:
              local_f8 = local_e8;
              std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar21);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_f8,uVar21,_Var22._M_head_impl);
              auVar19 = (undefined1  [8])(pointer)0xf;
              if (local_210 != (undefined1  [8])local_200) {
                auVar19 = local_200;
              }
              if ((ulong)auVar19 < local_208._M_p + local_f0) {
                pdVar20 = (pointer)0xf;
                if (local_f8 != local_e8) {
                  pdVar20 = local_e8[0];
                }
                if (pdVar20 < local_208._M_p + local_f0) goto LAB_00106100;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_f8,0,(char *)0x0,(ulong)local_210);
              }
              else {
LAB_00106100:
                puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_210,(ulong)local_f8);
              }
              local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              plVar11 = puVar10 + 2;
              if ((pointer *)*puVar10 == (pointer *)plVar11) {
                local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
                uStack_190 = puVar10[3];
              }
              else {
                local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)*plVar11;
                local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)*puVar10;
              }
              local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)puVar10[1];
              *puVar10 = plVar11;
              puVar10[1] = 0;
              *(undefined1 *)plVar11 = 0;
              if (local_f8 != local_e8) {
                operator_delete(local_f8,(long)local_e8[0] + 1);
              }
              if (local_210 != (undefined1  [8])local_200) {
                operator_delete((void *)local_210,(long)local_200 + 1);
              }
              if (local_168 != &local_158) {
                operator_delete(local_168,local_158 + 1);
              }
              if (local_d8 != local_c8) {
                operator_delete(local_d8,(long)local_c8[0] + 1);
              }
              if (local_188 != &local_178) {
                operator_delete(local_188,(long)local_178 + 1);
              }
              if (local_80 != &local_70) {
                operator_delete(local_80,local_70 + 1);
              }
              if (local_60[0] != local_50) {
                operator_delete(local_60[0],local_50[0] + 1);
              }
              local_210 = (undefined1  [8])local_200;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_210,
                         local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (undefined1 *)
                         ((long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                         (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start));
              _Var24._M_head_impl = (int)local_38;
              aStack_1f8._8_4_ = _Var24._M_head_impl;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                        (local_108,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)local_210);
              if (local_210 != (undefined1  [8])local_200) {
                operator_delete((void *)local_210,(long)local_200 + 1);
              }
              local_210 = (undefined1  [8])CONCAT44(_Var22._M_head_impl,_Var24._M_head_impl);
              local_208._M_p._4_4_ = (int)local_1b8;
              local_200[3] = local_1ac;
              local_200._1_2_ = local_1ae;
              local_200[0] = 1;
              std::
              _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
              ::_M_insert_unique<std::pair<int_const,std::tuple<bool,int,int,int>>>
                        (local_110,(pair<const_int,_std::tuple<bool,_int,_int,_int>_> *)local_210);
              local_210 = (undefined1  [8])local_200;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_210,
                         local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (undefined1 *)
                         ((long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                         (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start));
              aStack_1f8._12_4_ = local_214;
              local_1e8._M_head_impl = (int)local_1b8;
              local_1e4._M_head_impl = true;
              local_1e1 = local_1ac;
              local_1e3 = local_1ae;
              aStack_1f8._8_4_ = _Var22._M_head_impl;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>
                        (local_118,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                          *)local_210);
              if (local_210 != (undefined1  [8])local_200) {
                operator_delete((void *)local_210,(long)local_200 + 1);
              }
              local_210._0_4_ = _Var24._M_head_impl;
              local_208._M_p = local_200 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_208,
                         local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (undefined1 *)
                         ((long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                         (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start));
              std::
              _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                        (local_120,
                         (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_210);
              if (local_208._M_p != local_200 + 8) {
                operator_delete(local_208._M_p,aStack_1f8._0_8_ + 1);
              }
              if ((pointer *)
                  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              _Var22._M_head_impl = _Var22._M_head_impl + 1;
              pcVar26 = (pointer)(ulong)(_Var24._M_head_impl + 1);
            } while (_Var22._M_head_impl <
                     (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_100 - 2]);
          }
          if ((pointer *)local_1d8._0_8_ !=
              &local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)local_1d8._0_8_,
                            (long)local_1d8._Matrix.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 1);
          }
          local_214 = local_214 + 1;
          uVar18 = local_1b8;
        } while ((int)local_214 <
                 (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_1b8]);
      }
      uVar25 = uVar18;
    } while (2 < (long)local_100);
  }
  OVar3 = this->_OutputFunc;
  if (OVar3 == ACTIVATION) {
    std::function<double_(const_double_&)>::operator=(local_130,local_b8);
    std::function<double_(const_double_&)>::operator=(local_128,local_b0);
  }
  else if (OVar3 == LINEAR) {
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_130,(anon_class_1_0_00000001 *)local_210);
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_128,(anon_class_1_0_00000001 *)local_210);
  }
  else if (OVar3 == QUADRATIC) {
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_130,(anon_class_1_0_00000001 *)local_210);
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_128,(anon_class_1_0_00000001 *)local_210);
  }
  if ((this->_Preproc).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_1d8._0_8_ = (pointer **)0x0;
    local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (double *)0x0;
    local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (0 < *(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start) {
      iVar16 = 0;
      do {
        iVar7 = rand();
        local_210 = (undefined1  [8])((double)(iVar7 % 100) * 0.01);
        if (local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)&local_1d8,
                     (iterator)
                     local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,(double *)local_210);
        }
        else {
          *local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = (double)local_210;
          local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_1d8._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 < *(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    }
    if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00106985:
      std::__throw_bad_function_call();
    }
    else {
      (*(this->_Preproc)._M_invoker)
                (&local_1a8,local_a8,(vector<double,_std::allocator<double>_> *)&local_1d8,local_a0)
      ;
      if ((this->_NpPrep + 1) *
          (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] ==
          (int)((ulong)((long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
        if ((pointer *)
            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer **)local_1d8._0_8_ != (pointer **)0x0) {
          operator_delete((void *)local_1d8._0_8_,
                          (long)local_1d8._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - local_1d8._0_8_);
        }
        goto LAB_00106645;
      }
    }
    local_210 = (undefined1  [8])local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"FeedForwardNN: preprocessing function not well-formed.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_210,(long)local_208._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar12);
LAB_001069f8:
    exit(-10);
  }
LAB_00106645:
  if (*local_40 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nFeed-forward neural network initialised:",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- architecture = [ ",0x13);
    piVar5 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar27 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar27 != piVar5; piVar27 = piVar27 + 1) {
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- number of parameters = ",0x19);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->_Np);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- preprocessing function provided",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- number of parameters (NN + preprocessing) = ",0x2e);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->_Np);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," + ",3);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->_NpPrep);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," (",2);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->_NpPrep + this->_Np);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    }
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- NN output function: ",0x16);
    uVar25 = (ulong)this->_OutputFunc;
    if (2 < uVar25) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"unknown",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      local_210 = (undefined1  [8])local_200;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"FeedForwardNN: Unknown output function.","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_210,(long)local_208._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[0m",4);
      std::endl<char,std::char_traits<char>>(poVar12);
      goto LAB_001069f8;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,&DAT_0010a0b8 + *(int *)(&DAT_0010a0b8 + uVar25 * 4),
               *(long *)(&DAT_0010a0c8 + uVar25 * 8));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

FeedForwardNN(std::vector<int>           const& Arch,
                  int                        const& RandomSeed,
                  bool                       const& Report = false,
                  std::function<T(T const&)> const& ActFun = Sigmoid<T>,
                  std::function<T(T const&)> const& dActFun = dSigmoid<T>,
                  OutputFunction             const& OutputFunc = LINEAR,
                  Preprocessing              const& Preproc = nullptr,
                  std::vector<T>             const& PreprocPars = {}):
      _Arch(Arch),
      _ActFun(ActFun),
      _dActFun(dActFun),
      _OutputFunc(OutputFunc),
      _Preproc(Preproc),
      _PreprocPars(_Preproc == nullptr ? std::vector<T> {} : PreprocPars),
      _NpPrep((int) _PreprocPars.size())
    {
      // Number of layers
      const int nl = (int) _Arch.size();

      // Store sub seeds
      srand(RandomSeed);
      std::vector<int> sub_seeds;
      for (int l = 1; l < nl; l++)
        {
          sub_seeds.push_back(rand());
          sub_seeds.push_back(rand());
        }

      // Number of parameters of the NN
      _Np = 0;

      // Initialise links and biases with random numbers. Links are
      // treated as matrices that connect consecutive layers with as
      // many rows as nodes of the rightmost layer and as many columns
      // as the leftmost layer. Biases are treated as one-column
      // matrices associated to each layer (but the input one) with as
      // many rows as nodes.
      int iseed = 0;
      for (int l = 1; l < nl; l++)
        {
          _Links.insert({l, Matrix<T>{_Arch[l], _Arch[l - 1], sub_seeds.at(iseed++)}});
          _Biases.insert({l, Matrix<T>{_Arch[l], 1, sub_seeds.at(iseed++)}});
          _Np += _Arch[l] * (_Arch[l - 1] + 1);
        }

      // Construct maps that index the free parameters. Each parameter is
      // associated to an integer and a string.
      int count = 0;
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            const coordinates coord = std::make_tuple(false, l, i, 0);
            const std::string name = "B_" + std::to_string(l) + "_" + std::to_string(i);
            _StrIntMap.insert({name, count});
            _IntMap.insert({count, coord});
            _StrMap.insert({name, coord});
            _IntStrMap.insert({count++, name});

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              {
                const coordinates coord = std::make_tuple(true, l, i, j);
                const std::string name = "L_" + std::to_string(l) + "_" + std::to_string(i) + "_" + std::to_string(j);
                _StrIntMap.insert({name, count});
                _IntMap.insert({count, coord});
                _StrMap.insert({name, coord});
                _IntStrMap.insert({count++, name});
              }
          }

      // Define activation function of the output nodes and its
      // derivative.
      switch (_OutputFunc)
        {
        case ACTIVATION:
          _OutputActFun  = _ActFun;
          _dOutputActFun = _dActFun;
          break;
        case LINEAR:
          _OutputActFun  = [] (T const& x) -> T { return x; };
          _dOutputActFun = [] (T const&)   -> T { return T{1}; };
          break;
        case QUADRATIC:
          _OutputActFun  = [] (T const& x) -> T { return x * x; };
          _dOutputActFun = [] (T const& x) -> T { return 2 * x; };
          break;
        }

      // Check sanity of preprocessing function, if present
      if (_Preproc != nullptr)
        {
          // Generate random inputs between 0 and 1 but recasted as T
          std::vector<T> InPrep;
          for (int i = 0; i < _Arch.front(); i++)
            InPrep.push_back(T{1e-2 * ( rand() % 100 )});

          // Test preprocessing function
          const std::vector<T> OutPrep = _Preproc(InPrep, _PreprocPars);

          // Check that the number of outputs of the preprocessing
          // function is the same as that of the NN.
          if ((int) OutPrep.size() != ( _NpPrep + 1 ) * _Arch.back())
            Error("FeedForwardNN: preprocessing function not well-formed.");
        }

      // Report NN parameters
      if (Report)
        {
          std::cout << "\nFeed-forward neural network initialised:" << std::endl;
          std::cout << "- architecture = [ ";
          for (auto const& n : _Arch)
            std::cout << n << " ";
          std::cout << "]" << std::endl;
          if (_Preproc != nullptr)
            {
              std::cout << "- preprocessing function provided" << std::endl;
              std::cout << "- number of parameters (NN + preprocessing) = " << _Np << " + " << _NpPrep << " (" << _Np + _NpPrep << ")" << std::endl;
            }
          else
            std::cout << "- number of parameters = " << _Np << std::endl;
          std::cout << "- NN output function: ";
          switch (_OutputFunc)
            {
            case ACTIVATION:
              std::cout << "activation-like" << std::endl;
              break;
            case LINEAR:
              std::cout << "linear" << std::endl;
              break;
            case QUADRATIC:
              std::cout << "quadratic" << std::endl;
              break;
            default:
              std::cout << "unknown" << std::endl;
              Error("FeedForwardNN: Unknown output function.");
            }
          std::cout << "\n";
        }
    }